

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextGLImpl::Flush(DeviceContextGLImpl *this)

{
  long lVar1;
  string msg;
  string local_148 [2];
  long local_108 [17];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  undefined8 uStack_2c;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject !=
      (RenderPassGLImpl *)0x0) {
    FormatString<char[54]>
              (local_148,(char (*) [54])"Flushing device context inside an active render pass.");
    DebugAssertionFailed
              (local_148[0]._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x604);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148[0]._M_dataplus._M_p != &local_148[0].field_2) {
      operator_delete(local_148[0]._M_dataplus._M_p,local_148[0].field_2._M_allocated_capacity + 1);
    }
  }
  glFlush();
  lVar1 = 0;
  memset(local_148,0,0x124);
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[0] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[1] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[2] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[3] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[4] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[5] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[6] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[7] =
       (ShaderResourceCacheGL *)0x0;
  do {
    if (*(long *)((long)&(this->m_BindInfo).super_CommittedShaderResources.SRBs._M_elems[0].
                         m_pRefCounters + lVar1) != *(long *)((long)local_108 + lVar1)) {
      RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::Release
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> *)
                 ((long)&(this->m_BindInfo).super_CommittedShaderResources.SRBs._M_elems[0].
                         m_pRefCounters + lVar1));
      *(undefined8 *)
       ((long)&(this->m_BindInfo).super_CommittedShaderResources.SRBs._M_elems[0].m_pObject + lVar1)
           = *(undefined8 *)((long)local_108 + lVar1 + 8);
      *(undefined8 *)
       ((long)&(this->m_BindInfo).super_CommittedShaderResources.SRBs._M_elems[0].m_pRefCounters +
       lVar1) = *(undefined8 *)((long)local_108 + lVar1);
      *(undefined8 *)((long)local_108 + lVar1) = 0;
      *(undefined8 *)((long)local_108 + lVar1 + 8) = 0;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  (this->m_BindInfo).super_CommittedShaderResources.ResourcesValidated = (bool)(undefined1)local_68;
  (this->m_BindInfo).super_CommittedShaderResources.ActiveSRBMask = local_68._1_1_;
  (this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask = local_68._2_1_;
  (this->m_BindInfo).super_CommittedShaderResources.DynamicSRBMask = local_68._3_1_;
  *(undefined8 *)((this->m_BindInfo).super_CommittedShaderResources.CacheRevisions._M_elems + 4) =
       local_78;
  *(undefined8 *)((this->m_BindInfo).super_CommittedShaderResources.CacheRevisions._M_elems + 6) =
       uStack_70;
  *(long *)(this->m_BindInfo).super_CommittedShaderResources.CacheRevisions._M_elems =
       local_108[0x10];
  *(undefined8 *)((this->m_BindInfo).super_CommittedShaderResources.CacheRevisions._M_elems + 2) =
       uStack_80;
  *(undefined8 *)&(this->m_BindInfo).super_CommittedShaderResources.field_0xe4 = local_64;
  *(undefined8 *)&(this->m_BindInfo).field_0xec = uStack_5c;
  *(undefined8 *)&(this->m_BindInfo).field_0xf4 = local_54;
  *(undefined8 *)&(this->m_BindInfo).field_0xfc = uStack_4c;
  *(undefined8 *)&(this->m_BindInfo).field_0x104 = local_44;
  *(undefined8 *)&(this->m_BindInfo).field_0x10c = uStack_3c;
  *(undefined8 *)&(this->m_BindInfo).field_0x114 = local_34;
  *(undefined8 *)&(this->m_BindInfo).field_0x11c = uStack_2c;
  lVar1 = 0xb0;
  do {
    RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::Release
              ((RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> *)
               ((long)&local_148[0]._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0x30);
  return;
}

Assistant:

void DeviceContextGLImpl::Flush()
{
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Flushing device context inside an active render pass.");

    glFlush();

    m_BindInfo = {};
}